

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  Index IVar1;
  Result RVar2;
  pointer pCVar3;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_100;
  Location local_f8;
  Var local_d8;
  Location local_90;
  Var local_70;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> local_28;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> expr;
  Index table_index_local;
  Index sig_index_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.
  super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>.
  super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl._0_4_ = table_index;
  expr._M_t.
  super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>.
  super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl._4_4_ = sig_index;
  MakeUnique<wabt::CallIndirectExpr>();
  pCVar3 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
           operator->(&local_28);
  IVar1 = expr._M_t.
          super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>
          .super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl._4_4_;
  GetLocation(&local_90,this);
  Var::Var(&local_70,IVar1,&local_90);
  SetFuncDeclaration(this,&pCVar3->decl,&local_70);
  Var::~Var(&local_70);
  IVar1 = (Index)expr._M_t.
                 super___uniq_ptr_impl<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::CallIndirectExpr_*,_std::default_delete<wabt::CallIndirectExpr>_>
                 .super__Head_base<0UL,_wabt::CallIndirectExpr_*,_false>._M_head_impl;
  Location::Location(&local_f8);
  Var::Var(&local_d8,IVar1,&local_f8);
  pCVar3 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
           operator->(&local_28);
  Var::operator=(&pCVar3->table,&local_d8);
  Var::~Var(&local_d8);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::CallIndirectExpr,std::default_delete<wabt::CallIndirectExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_100,&local_28);
  RVar2 = AppendExpr(this,&local_100);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_100);
  std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::~unique_ptr
            (&local_28);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnCallIndirectExpr(Index sig_index, Index table_index) {
  auto expr = MakeUnique<CallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index);
  return AppendExpr(std::move(expr));
}